

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall rapidxml::memory_pool<char>::clear(memory_pool<char> *this)

{
  char *pcVar1;
  EVP_PKEY_CTX *in_RSI;
  char *previous_begin;
  memory_pool<char> *this_local;
  
  while (this->m_begin != this->m_static_memory) {
    in_RSI = (EVP_PKEY_CTX *)this->m_begin;
    pcVar1 = align(this,(char *)in_RSI);
    pcVar1 = *(char **)pcVar1;
    if (this->m_free_func == (free_func *)0x0) {
      if (this->m_begin != (char *)0x0) {
        operator_delete__(this->m_begin);
      }
    }
    else {
      (*this->m_free_func)(this->m_begin);
    }
    this->m_begin = pcVar1;
  }
  init(this,in_RSI);
  return;
}

Assistant:

void clear()
        {
            while (m_begin != m_static_memory)
            {
                char *previous_begin = reinterpret_cast<header *>(align(m_begin))->previous_begin;
                if (m_free_func)
                    m_free_func(m_begin);
                else
                    delete[] m_begin;
                m_begin = previous_begin;
            }
            init();
        }